

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

string * __thiscall
ArgsManager::GetChainTypeString_abi_cxx11_(string *__return_storage_ptr__,ArgsManager *this)

{
  pointer pcVar1;
  variant_alternative_t<1UL,_variant<ChainType,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *pvVar2;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 local_41;
  _Variadic_union<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  byte local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetChainArg_abi_cxx11_
            ((variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40._M_first,this);
  if (local_20 == 0) {
    ChainTypeToString_abi_cxx11_(__return_storage_ptr__,(ChainType)local_40._M_first._M_storage);
  }
  else {
    pvVar2 = std::get<1ul,ChainType,std::__cxx11::string>
                       ((variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_40._M_first);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pvVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pvVar2->_M_string_length);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_20]._M_data)
            (&local_41,
             (variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40._M_first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ArgsManager::GetChainTypeString() const
{
    auto arg = GetChainArg();
    if (auto* parsed = std::get_if<ChainType>(&arg)) return ChainTypeToString(*parsed);
    return std::get<std::string>(arg);
}